

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_int_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_int_&,_const_int_&> *this,ostream *os)

{
  StringRef local_68;
  string local_50;
  string local_30;
  
  Detail::stringify<int>(&local_30,this->m_lhs);
  local_68.m_start = (this->m_op).m_start;
  local_68.m_size = (this->m_op).m_size;
  local_68.m_data = (char *)0x0;
  Detail::stringify<int>(&local_50,this->m_rhs);
  formatReconstructedExpression((ostream *)os,(string *)&local_30,&local_68,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  StringRef::~StringRef(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }